

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O3

void __thiscall cp::PlanFootprints::calcNextFootprintOld(PlanFootprints *this)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  Packet2d b_zw;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar18;
  undefined1 auVar16 [16];
  double dVar19;
  undefined1 auVar17 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  whichWalkOrStep(this);
  if (calcNextFootprintOld()::before_land_pos == '\0') {
    calcNextFootprintOld(this);
  }
  if (calcNextFootprintOld()::before_land_dis == '\0') {
    calcNextFootprintOld(this);
  }
  dVar20 = 0.0;
  dVar6 = 0.0;
  dVar5 = calcNextFootprintOld::before_land_pos.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  switch(*(undefined4 *)(this + 0x308)) {
  case 1:
    dVar20 = calcNextFootprintOld::before_land_pos.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
             + calcNextFootprintOld::before_land_pos.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0] + (*(double *)(this + 0x2e8) -
                     calcNextFootprintOld::before_land_pos.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[0]);
    dVar5 = *(double *)(this + 0x2f0);
    if (0.0 <= dVar5 || *(int *)(this + 0x2e0) != 0) {
      dVar6 = calcNextFootprintOld::before_land_dis.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      if (0.0 <= dVar5 && *(int *)(this + 0x2e0) == 1) {
        dVar6 = (double)(~-(ulong)(calcNextFootprintOld::before_land_dis.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[1] < 0.0) & (ulong)dVar5);
      }
    }
    else {
      dVar6 = (double)(~-(ulong)(0.0 < calcNextFootprintOld::before_land_dis.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                       m_storage.m_data.array[1]) & (ulong)dVar5);
    }
  default:
    goto switchD_00109223_caseD_2;
  case 5:
    iVar2 = *(int *)(this + 0x2e0);
    dVar20 = *(double *)(this + 0x2e8);
    break;
  case 6:
  case 7:
  case 9:
    dVar20 = *(double *)(this + 0x2e8);
    iVar2 = *(int *)(this + 0x2e0);
    dVar5 = *(double *)(this + 0x2f0);
    break;
  case 8:
    dVar20 = calcNextFootprintOld::before_land_pos.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    dVar6 = 0.0;
    if ((calcNextFootprintOld::before_land_pos.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] <
         0.0 && *(int *)(this + 0x2e0) == 0) ||
       (0.0 <= calcNextFootprintOld::before_land_pos.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1] && *(int *)(this + 0x2e0) == 1)) goto switchD_00109223_caseD_2;
    goto LAB_0010932c;
  }
  if ((dVar5 < 0.0 && iVar2 == 0) || (dVar6 = 0.0, 0.0 <= dVar5 && iVar2 == 1)) {
LAB_0010932c:
    dVar6 = dVar5;
  }
switchD_00109223_caseD_2:
  dVar5 = *(double *)(this + 0x300);
  dVar4 = cos(dVar5 * 0.5);
  dVar5 = sin(dVar5 * 0.5);
  dVar8 = dVar5 * 0.0;
  dVar9 = dVar8 * 0.0;
  dVar21 = dVar9 - dVar5 * 0.0;
  auVar27._8_4_ = SUB84(dVar21,0);
  auVar27._0_8_ = dVar9 - dVar4 * 0.0;
  auVar27._12_4_ = (int)((ulong)dVar21 >> 0x20);
  dVar23 = SUB168(auVar27 ^ _DAT_0010a040,0) + dVar5 * 0.0 + dVar8;
  dVar24 = SUB168(auVar27 ^ _DAT_0010a040,8) + dVar4 * 0.0 + dVar8;
  dVar21 = dVar5 * 0.0 + dVar9;
  auVar15._8_4_ = SUB84(dVar21,0);
  auVar15._0_8_ = dVar4 * 0.0 + dVar9;
  auVar15._12_4_ = (int)((ulong)dVar21 >> 0x20);
  dVar13 = SUB168(auVar15 ^ _DAT_0010a050,0) + (dVar5 - dVar8 * 0.0);
  dVar18 = SUB168(auVar15 ^ _DAT_0010a050,8) + (dVar4 - dVar8 * 0.0);
  dVar5 = *(double *)(this + 0x300) * 0.5 * 0.5;
  dVar4 = cos(dVar5);
  dVar8 = sin(dVar5);
  auVar15 = _DAT_0010a050;
  dVar9 = dVar8 * 0.0;
  dVar21 = dVar9 * 0.0;
  dVar5 = dVar21 - dVar8 * 0.0;
  auVar16._8_4_ = SUB84(dVar5,0);
  auVar16._0_8_ = dVar21 - dVar4 * 0.0;
  auVar16._12_4_ = (int)((ulong)dVar5 >> 0x20);
  auVar27 = ZEXT816(0x8000000000000000);
  dVar14 = SUB168(auVar16 ^ auVar27,0) + dVar8 * 0.0 + dVar9;
  dVar19 = SUB168(auVar16 ^ auVar27,8) + dVar4 * 0.0 + dVar9;
  dVar5 = dVar8 * 0.0 + dVar21;
  auVar11._8_4_ = SUB84(dVar5,0);
  auVar11._0_8_ = dVar4 * 0.0 + dVar21;
  auVar11._12_4_ = (int)((ulong)dVar5 >> 0x20);
  dVar10 = SUB168(auVar11 ^ _DAT_0010a050,0) + (dVar8 - dVar9 * 0.0);
  dVar12 = SUB168(auVar11 ^ _DAT_0010a050,8) + (dVar4 - dVar9 * 0.0);
  lVar3 = (ulong)*(uint *)(this + 0x2e0) * 0xe0;
  dVar21 = *(double *)(this + lVar3 + 0x10 + 8);
  uVar1 = *(undefined8 *)(this + lVar3 + 800);
  dVar5 = *(double *)(this + lVar3 + 0x30);
  dVar4 = *(double *)(this + lVar3 + 0x38);
  dVar8 = *(double *)(this + lVar3 + 0x40);
  dVar9 = *(double *)(this + lVar3 + 0x48);
  dVar25 = dVar23 * dVar8 - dVar13 * dVar5;
  auVar26._8_4_ = SUB84(dVar25,0);
  auVar26._0_8_ = dVar24 * dVar8 - dVar18 * dVar5;
  auVar26._12_4_ = (int)((ulong)dVar25 >> 0x20);
  dVar25 = dVar5 * dVar23 + dVar8 * dVar13;
  auVar22._8_4_ = SUB84(dVar25,0);
  auVar22._0_8_ = dVar5 * dVar24 + dVar8 * dVar18;
  auVar22._12_4_ = (int)((ulong)dVar25 >> 0x20);
  auVar22 = auVar22 ^ _DAT_0010a050;
  *(double *)(this + lVar3 + 0x10) = *(double *)(this + lVar3 + 0x10) + dVar20;
  *(double *)(this + lVar3 + 0x10 + 8) = dVar21 + dVar6;
  *(undefined8 *)(this + lVar3 + 0x20) = uVar1;
  *(double *)(this + lVar3 + 0x30) = SUB168(auVar26 ^ auVar27,0) + dVar13 * dVar4 + dVar23 * dVar9;
  *(double *)(this + lVar3 + 0x30 + 8) =
       SUB168(auVar26 ^ auVar27,8) + dVar18 * dVar4 + dVar24 * dVar9;
  *(double *)(this + lVar3 + 0x40) = auVar22._0_8_ + (dVar9 * dVar13 - dVar4 * dVar23);
  *(double *)(this + lVar3 + 0x40 + 8) = auVar22._8_8_ + (dVar9 * dVar18 - dVar4 * dVar24);
  dVar4 = *(double *)(this + 0x2b0);
  dVar8 = *(double *)(this + 0x2b8);
  dVar9 = *(double *)(this + 0x2c0);
  dVar21 = *(double *)(this + 0x2c8);
  dVar5 = dVar14 * dVar9 - dVar10 * dVar4;
  auVar17._8_4_ = SUB84(dVar5,0);
  auVar17._0_8_ = dVar19 * dVar9 - dVar12 * dVar4;
  auVar17._12_4_ = (int)((ulong)dVar5 >> 0x20);
  dVar5 = dVar4 * dVar14 + dVar9 * dVar10;
  auVar7._8_4_ = SUB84(dVar5,0);
  auVar7._0_8_ = dVar4 * dVar19 + dVar9 * dVar12;
  auVar7._12_4_ = (int)((ulong)dVar5 >> 0x20);
  *(double *)(this + 0x2b0) = SUB168(auVar17 ^ auVar27,0) + dVar10 * dVar8 + dVar14 * dVar21;
  *(double *)(this + 0x2b8) = SUB168(auVar17 ^ auVar27,8) + dVar12 * dVar8 + dVar19 * dVar21;
  *(double *)(this + 0x2c0) = SUB168(auVar7 ^ auVar15,0) + (dVar21 * dVar10 - dVar8 * dVar14);
  *(double *)(this + 0x2c8) = SUB168(auVar7 ^ auVar15,8) + (dVar21 * dVar12 - dVar8 * dVar19);
  calcNextFootprintOld::before_land_pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  .m_storage.m_data.array[0] = *(double *)(this + 0x2e8);
  calcNextFootprintOld::before_land_pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  .m_storage.m_data.array[1] = *(double *)(this + 0x2f0);
  calcNextFootprintOld::before_land_pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  .m_storage.m_data.array[2] = *(double *)(this + 0x2f8);
  calcNextFootprintOld::before_land_dis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  .m_storage.m_data.array[0] = dVar20;
  calcNextFootprintOld::before_land_dis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  .m_storage.m_data.array[1] = dVar6;
  calcNextFootprintOld::before_land_dis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  .m_storage.m_data.array[2] = 0.0;
  return;
}

Assistant:

void PlanFootprints::calcNextFootprintOld() {
  whichWalkOrStep();
  static Vector3 before_land_pos(step_vector.x(), step_vector.y(), 0.0);
  static Vector3 before_land_dis(step_vector.x(), step_vector.y(), 0.0);

  // calc next step land position
  Vector3 next_land_distance(0.0, 0.0, 0.0);
  if (wstate == starting1 || wstate == starting2 || wstate == step2walk) {
    next_land_distance[0] = step_vector.x();
    next_land_distance[1] = isCollisionLegs(step_vector.y()) ? step_vector.y() : 0.0;
  } else if (wstate == stop_next) {  // walking stop
    next_land_distance[0] = step_vector.x();
    next_land_distance[1] =
        isCollisionLegs(before_land_pos.y()) ? before_land_pos.y() : 0.0;
  } else if (wstate == walk2step) {  // walk -> step
    next_land_distance[0] = before_land_pos.x();
    next_land_distance[1] =
        isCollisionLegs(before_land_pos.y()) ? 0.0 : before_land_pos.y();
  } else if (wstate == walk) {
    next_land_distance[0] =
        before_land_pos.x() * 2 + (step_vector.x() - before_land_pos.x());
    next_land_distance[1] = isCollisionLegs(step_vector.y(), before_land_dis.y());
  } else {
    next_land_distance[0] = 0.0;
    next_land_distance[1] = 0.0;
  }

  // calc next step land rotation
  Quat foot_rot = rpy2q(0.0, 0.0, step_angle);
  Quat waist_rot = rpy2q(0.0, 0.0, step_angle * 0.5);

  // swing leg
  Vector3 swing_p(
      ref_land_pose[swingleg].p().x() + next_land_distance[0],
      ref_land_pose[swingleg].p().y() + next_land_distance[1],
      init_feet_pose[swingleg].p().z());
  Quat swing_q = ref_land_pose[swingleg].q() * foot_rot;

  // set next landing position
  ref_land_pose[swingleg].set(swing_p, swing_q);
  ref_waist_r = ref_waist_r * waist_rot;

  before_land_pos = step_vector;
  before_land_dis = next_land_distance;
}